

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqFlucCorrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::FreqFlucCorrFunc::validateSelection(FreqFlucCorrFunc *this,SelectionManager *param_2)

{
  bool bVar1;
  MultipoleAdapter ma;
  AtomType *at;
  int i;
  StuntDouble *sd;
  MultipoleAdapter *in_stack_00000038;
  MultipoleAdapter local_30;
  AtomType *in_stack_ffffffffffffffd8;
  SelectionManager *in_stack_ffffffffffffffe0;
  Atom *local_18;
  
  local_18 = (Atom *)SelectionManager::beginSelected
                               (in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8);
  while (local_18 != (Atom *)0x0) {
    bVar1 = StuntDouble::isRigidBody(&local_18->super_StuntDouble);
    if (!bVar1) {
      in_stack_ffffffffffffffd8 = Atom::getAtomType(local_18);
      MultipoleAdapter::MultipoleAdapter(&local_30,in_stack_ffffffffffffffd8);
      bVar1 = MultipoleAdapter::isDipole(in_stack_00000038);
      if (!bVar1) {
        snprintf(painCave.errMsg,2000,
                 "FreqFlucCorrFunc::validateSelection Error: selection is not a RigidBody or does\n\tnot have a dipole\n"
                );
        painCave.isFatal = 1;
        simError();
      }
    }
    local_18 = (Atom *)SelectionManager::nextSelected
                                 (in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void FreqFlucCorrFunc::validateSelection(SelectionManager&) {
    StuntDouble* sd;
    int i;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      if (!sd->isRigidBody()) {
        AtomType* at        = static_cast<Atom*>(sd)->getAtomType();
        MultipoleAdapter ma = MultipoleAdapter(at);

        if (!ma.isDipole()) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "FreqFlucCorrFunc::validateSelection Error: selection is not a "
              "RigidBody "
              "or does\n"
              "\tnot have a dipole\n");
          painCave.isFatal = 1;
          simError();
        }
      }
    }
  }